

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

void __thiscall
duckdb::AsOfProbeBuffer::AsOfProbeBuffer
          (AsOfProbeBuffer *this,ClientContext *context,PhysicalAsOfJoin *op)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  bool enabled_p;
  Allocator *pAVar1;
  BufferManager *pBVar2;
  ClientConfig *pCVar3;
  idx_t iVar4;
  const_reference pvVar5;
  type expr;
  pointer *__ptr;
  pointer *__ptr_1;
  Orders partitions;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  partition_stats;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_68;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  local_48;
  
  this->context = context;
  pAVar1 = Allocator::Get(context);
  this->allocator = pAVar1;
  this->op = op;
  pBVar2 = BufferManager::GetBufferManager(context);
  this->buffer_manager = pBVar2;
  pCVar3 = ClientConfig::GetConfig(context);
  this->force_external = pCVar3->force_external;
  iVar4 = PhysicalOperator::GetMaxThreadMemory(context);
  this->memory_per_thread = iVar4;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lhs_sel).sel_vector = (sel_t *)0x0;
  (this->lhs_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->lhs_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->left_hash).ptr = (PartitionGlobalHashGroup *)0x0;
  enabled_p = IsLeftOuterJoin((op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->left_outer,enabled_p);
  (this->left_itr).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->lhs_scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = (PayloadScanner *)0x0;
  DataChunk::DataChunk(&this->lhs_payload);
  (this->right_outer).ptr = (OuterJoinMarker *)0x0;
  (this->right_itr).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  this->left_group = 0;
  (this->right_hash).ptr = (PartitionGlobalHashGroup *)0x0;
  (this->rhs_scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = (PayloadScanner *)0x0;
  DataChunk::DataChunk(&this->rhs_payload);
  (this->filter_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->filter_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->right_group = 0;
  (this->filter_sel).sel_vector = (sel_t *)0x0;
  ExpressionExecutor::ExpressionExecutor(&this->filterer,context);
  this->fetch_next_left = true;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PartitionGlobalSinkState::GenerateOrderings
            ((Orders *)&local_68,&this->lhs_orders,&op->lhs_partitions,&op->lhs_orders,
             (vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
              *)&local_48);
  pAVar1 = this->allocator;
  this_00 = &(op->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
             super_PhysicalOperator.children;
  pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  DataChunk::Initialize(&this->lhs_payload,pAVar1,&pvVar5->_M_data->types,0x800);
  pAVar1 = this->allocator;
  pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,1);
  DataChunk::Initialize(&this->rhs_payload,pAVar1,&pvVar5->_M_data->types,0x800);
  SelectionVector::Initialize(&this->lhs_sel,0x800);
  OuterJoinMarker::Initialize(&this->left_outer,0x800);
  if ((op->predicate).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    SelectionVector::Initialize(&this->filter_sel,0x800);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&op->predicate);
    ExpressionExecutor::AddExpression(&this->filterer,expr);
  }
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

AsOfProbeBuffer::AsOfProbeBuffer(ClientContext &context, const PhysicalAsOfJoin &op)
    : context(context), allocator(Allocator::Get(context)), op(op),
      buffer_manager(BufferManager::GetBufferManager(context)), force_external(IsExternal(context)),
      memory_per_thread(op.GetMaxThreadMemory(context)), left_outer(IsLeftOuterJoin(op.join_type)), filterer(context),
      fetch_next_left(true) {
	vector<unique_ptr<BaseStatistics>> partition_stats;
	Orders partitions; // Not used.
	PartitionGlobalSinkState::GenerateOrderings(partitions, lhs_orders, op.lhs_partitions, op.lhs_orders,
	                                            partition_stats);

	//	We sort the row numbers of the incoming block, not the rows
	lhs_payload.Initialize(allocator, op.children[0].get().GetTypes());
	rhs_payload.Initialize(allocator, op.children[1].get().GetTypes());

	lhs_sel.Initialize();
	left_outer.Initialize(STANDARD_VECTOR_SIZE);

	if (op.predicate) {
		filter_sel.Initialize();
		filterer.AddExpression(*op.predicate);
	}
}